

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

void kj::Arena::destroyObject<capnp::compiler::NodeTranslator::StructLayout::Union>(void *pointer)

{
  void *pointer_local;
  
  dtor<capnp::compiler::NodeTranslator::StructLayout::Union>((Union *)pointer);
  return;
}

Assistant:

static void destroyObject(void* pointer) {
    dtor(*reinterpret_cast<T*>(pointer));
  }